

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmanager.cpp
# Opt level: O0

Class * __thiscall camp::detail::ClassManager::getById(ClassManager *this,string *id)

{
  bool bVar1;
  ClassNotFound *__return_storage_ptr__;
  ClassInfo *pCVar2;
  element_type *peVar3;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [48];
  ClassNotFound local_78;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>_>
  local_30;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>_>
  local_28;
  const_iterator it;
  IdIndex *ids;
  string *id_local;
  ClassManager *this_local;
  
  it.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>
             *)boost::multi_index::
               multi_index_container<camp::detail::ClassManager::ClassInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::ClassManager::ClassInfo>_>
               ::get<camp::detail::ClassManager::Id>(&this->m_classes);
  local_28.node =
       (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>
        *)boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<camp::detail::ClassManager::ClassInfo,std::__cxx11::string,&camp::detail::ClassManager::ClassInfo::id>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<1,camp::detail::ClassManager::ClassInfo,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::ClassManager::ClassInfo,std::__cxx11::string,&camp::detail::ClassManager::ClassInfo::id>,mpl_::na>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::ClassManager::ClassInfo,std::__cxx11::string,&camp::detail::ClassManager::ClassInfo::name>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<camp::detail::ClassManager::ClassInfo>>,boost::mpl::v_item<camp::detail::ClassManager::Id,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<camp::detail::ClassManager::ClassInfo,std::__cxx11::string,&camp::detail::ClassManager::ClassInfo::id>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<1,camp::detail::ClassManager::ClassInfo,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::ClassManager::ClassInfo,std::__cxx11::string,&camp::detail::ClassManager::ClassInfo::id>,mpl_::na>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::ClassManager::ClassInfo,std::__cxx11::string,&camp::detail::ClassManager::ClassInfo::name>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<camp::detail::ClassManager::ClassInfo>>,boost::mpl::v_item<camp::detail::ClassManager::Id,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)it.node,id);
  local_30.node =
       (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>
        *)boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::id>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::multi_index::detail::nth_layer<1,_camp::detail::ClassManager::ClassInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::ClassManager::ClassInfo>_>,_boost::mpl::v_item<camp::detail::ClassManager::Id,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::end(it.node);
  bVar1 = boost::multi_index::detail::operator==(&local_28,&local_30);
  if (!bVar1) {
    pCVar2 = boost::operators_impl::
             dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>_>,_const_camp::detail::ClassManager::ClassInfo_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_camp::detail::ClassManager::ClassInfo,_long,_const_camp::detail::ClassManager::ClassInfo_*,_const_camp::detail::ClassManager::ClassInfo_&>_>_>
             ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>_>,_const_camp::detail::ClassManager::ClassInfo_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_camp::detail::ClassManager::ClassInfo,_long,_const_camp::detail::ClassManager::ClassInfo_*,_const_camp::detail::ClassManager::ClassInfo_&>_>_>
                           *)&local_28);
    peVar3 = std::__shared_ptr_access<camp::Class,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<camp::Class,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&pCVar2->classPtr);
    return peVar3;
  }
  __return_storage_ptr__ = (ClassNotFound *)__cxa_allocate_exception(0x48);
  ClassNotFound::ClassNotFound(&local_78,id);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/classmanager.cpp"
             ,&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d0,"const Class &camp::detail::ClassManager::getById(const std::string &) const",
             &local_d1);
  Error::prepare<camp::ClassNotFound>
            (__return_storage_ptr__,&local_78,(string *)local_a8,0x70,(string *)local_d0);
  __cxa_throw(__return_storage_ptr__,&ClassNotFound::typeinfo,ClassNotFound::~ClassNotFound);
}

Assistant:

const Class& ClassManager::getById(const std::string& id) const
{
    const IdIndex& ids = m_classes.get<Id>();

    IdIndex::const_iterator it = ids.find(id);
    if (it == ids.end())
        CAMP_ERROR(ClassNotFound(id));

    return *it->classPtr;
}